

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  bool bVar1;
  ImFontConfig *pIVar2;
  ImFont **ppIVar3;
  void *pvVar4;
  long *in_RSI;
  byte *in_RDI;
  ImFontConfig *new_font_cfg;
  ImFontConfig *in_stack_ffffffffffffff98;
  ImFontAtlas *in_stack_ffffffffffffffa0;
  ImFont *in_stack_ffffffffffffffd0;
  
  if ((*in_RDI & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x734,"AddFont","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  if ((*in_RSI == 0) || ((int)in_RSI[1] < 1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x735,"AddFont","ImGui ASSERT FAILED: %s",
                "font_cfg->FontData != NULL && font_cfg->FontDataSize > 0");
  }
  if (*(float *)((long)in_RSI + 0x14) <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x736,"AddFont","ImGui ASSERT FAILED: %s","font_cfg->SizePixels > 0.0f");
  }
  if ((*(byte *)(in_RSI + 9) & 1) == 0) {
    in_stack_ffffffffffffffa0 = (ImFontAtlas *)(in_RDI + 0x40);
    ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0);
    operator_new(0x78);
    ImFont::ImFont(in_stack_ffffffffffffffd0);
    ImVector<ImFont_*>::push_back
              ((ImVector<ImFont_*> *)in_stack_ffffffffffffffa0,(ImFont **)in_stack_ffffffffffffff98)
    ;
  }
  else {
    bVar1 = ImVector<ImFont_*>::empty((ImVector<ImFont_*> *)(in_RDI + 0x40));
    if (bVar1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0x73c,"AddFont","ImGui ASSERT FAILED: %s",
                  "!Fonts.empty() && \"Cannot use MergeMode for the first font\"");
    }
  }
  ImVector<ImFontConfig>::push_back
            ((ImVector<ImFontConfig> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pIVar2 = ImVector<ImFontConfig>::back((ImVector<ImFontConfig> *)in_stack_ffffffffffffffa0);
  if (pIVar2->DstFont == (ImFont *)0x0) {
    ppIVar3 = ImVector<ImFont_*>::back((ImVector<ImFont_*> *)in_stack_ffffffffffffffa0);
    pIVar2->DstFont = *ppIVar3;
  }
  if ((pIVar2->FontDataOwnedByAtlas & 1U) == 0) {
    pvVar4 = ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0);
    pIVar2->FontData = pvVar4;
    pIVar2->FontDataOwnedByAtlas = true;
    memcpy(pIVar2->FontData,(void *)*in_RSI,(long)pIVar2->FontDataSize);
  }
  if (pIVar2->DstFont->EllipsisChar == 0xffff) {
    pIVar2->DstFont->EllipsisChar = *(ImWchar *)((long)in_RSI + 0x54);
  }
  ClearTexData(in_stack_ffffffffffffffa0);
  return pIVar2->DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}